

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDockableDragDropTarget(ImGuiWindow *window)

{
  float fVar1;
  ImGuiWindow *root_payload;
  ImGuiTabBar *pIVar2;
  ImGuiDockNode *pIVar3;
  ImGuiContext *ctx;
  bool bVar4;
  bool is_explicit_target;
  int iVar5;
  ImGuiPayload *pIVar6;
  ImGuiDockNode *host_node;
  ImGuiDockNode *host_node_00;
  ImGuiDockPreviewData *data;
  ImRect explicit_target_rect;
  ImVec2 local_288;
  ImVec2 aIStack_280 [2];
  ImVec2 local_270;
  float fStack_268;
  float fStack_264;
  ImGuiDockNode *local_260;
  ImGuiDockNode *pIStack_258;
  ImGuiDockNode *local_250;
  ImVector<ImGuiWindow_*> local_248;
  ImGuiTabBar *local_238;
  ImVec2 local_230;
  ImVec2 IStack_228;
  ImVec2 local_220;
  int local_218;
  ImGuiWindowClass local_214;
  ImGuiDockNodeState local_200;
  ImGuiWindow *local_1f8;
  ImGuiWindow *pIStack_1f0;
  ImGuiDockNode *local_1e8;
  ImGuiDockNode *pIStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined2 local_1c0;
  undefined1 local_1be;
  uint local_1b8 [2];
  ImGuiDockNode *local_1b0;
  undefined8 local_1a8;
  ImVec2 local_1a0;
  ImVec2 IStack_198;
  ImVec2 local_190;
  ImVec2 IStack_188;
  ImVec2 local_180;
  ImVec2 IStack_178;
  ImVec2 local_170;
  ImVec2 IStack_168;
  ImVec2 local_160;
  ImVec2 IStack_158;
  ImGuiDockPreviewData local_150;
  
  ctx = GImGui;
  if (GImGui->DragDropActive == true) {
    local_270 = window->Pos;
    fStack_268 = (window->Size).x + (window->Pos).x;
    fStack_264 = (window->Size).y + (window->Pos).y;
    data = (ImGuiDockPreviewData *)&local_270;
    bVar4 = BeginDragDropTargetCustom((ImRect *)data,window->ID);
    if (bVar4) {
      if (((ctx->DragDropPayload).DataFrameCount != -1) &&
         (iVar5 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType), iVar5 == 0)) {
        root_payload = *(ctx->DragDropPayload).Data;
        bVar4 = DockNodeIsDropAllowed(window,root_payload);
        if ((bVar4) &&
           (pIVar6 = AcceptDragDropPayload("_IMWINDOW",0xc00), pIVar6 != (ImGuiPayload *)0x0)) {
          if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
            host_node = window->DockNode;
            bVar4 = host_node == (ImGuiDockNode *)0x0;
          }
          else {
            host_node = DockNodeTreeFindNodeByPos(window->DockNodeAsHost,(ctx->IO).MousePos);
            bVar4 = false;
          }
          if (((host_node == (ImGuiDockNode *)0x0) ||
              (pIVar2 = host_node->TabBar, pIVar2 == (ImGuiTabBar *)0x0)) ||
             ((host_node->LocalFlags & 0x3000) != 0)) {
            fVar1 = (GImGui->Style).FramePadding.y;
            local_288 = window->Pos;
            aIStack_280[0].y = fVar1 + fVar1 + GImGui->FontSize + (window->Pos).y;
            aIStack_280[0].x = (window->Size).x + (window->Pos).x;
          }
          else {
            local_288 = (pIVar2->BarRect).Min;
            aIStack_280[0] = (pIVar2->BarRect).Max;
          }
          is_explicit_target = true;
          if ((ctx->IO).ConfigDockingWithShift == false) {
            is_explicit_target = IsMouseHoveringRect(&local_288,aIStack_280,true);
          }
          if ((((ctx->DragDropPayload).Preview != false) ||
              ((ctx->DragDropPayload).Delivery == true)) &&
             ((bool)(host_node != (ImGuiDockNode *)0x0 | bVar4))) {
            local_248.Size = 0;
            local_248.Capacity = 0;
            local_248.Data = (ImGuiWindow **)0x0;
            local_214.ClassId = 0;
            local_214.ParentViewportId = 0;
            local_214.ViewportFlagsOverrideSet = 0;
            local_214.ViewportFlagsOverrideClear = 0;
            local_214.DockingAlwaysTabBar = false;
            local_214.DockingAllowUnclassed = true;
            local_230.x = 0.0;
            local_230.y = 0.0;
            IStack_228.x = 0.0;
            IStack_228.y = 0.0;
            local_220.x = 0.0;
            local_220.y = 0.0;
            local_270.x = 0.0;
            local_270.y = 0.0;
            fStack_268 = 0.0;
            local_238 = (ImGuiTabBar *)0x0;
            local_260 = (ImGuiDockNode *)0x0;
            pIStack_258 = (ImGuiDockNode *)0x0;
            local_250 = (ImGuiDockNode *)0x0;
            local_218 = -1;
            local_200 = ImGuiDockNodeState_Unknown;
            local_1f8 = (ImGuiWindow *)0x0;
            pIStack_1f0 = (ImGuiWindow *)0x0;
            local_1e8 = (ImGuiDockNode *)0x0;
            pIStack_1e0 = (ImGuiDockNode *)0x0;
            local_1d8._0_4_ = -1;
            local_1d8._4_4_ = -1;
            uStack_1d0._0_4_ = -1;
            uStack_1d0._4_4_ = 0;
            local_1c8._0_4_ = 0;
            local_1c8._4_4_ = 0;
            local_1c0 = 0x209;
            local_1be = 0;
            local_160.x = 0.0;
            local_160.y = 0.0;
            IStack_158.x = 0.0;
            IStack_158.y = 0.0;
            local_170.x = 0.0;
            local_170.y = 0.0;
            IStack_168.x = 0.0;
            IStack_168.y = 0.0;
            local_180.x = 0.0;
            local_180.y = 0.0;
            IStack_178.x = 0.0;
            IStack_178.y = 0.0;
            local_190.x = 0.0;
            local_190.y = 0.0;
            IStack_188.x = 0.0;
            IStack_188.y = 0.0;
            local_1a0.x = 0.0;
            local_1a0.y = 0.0;
            IStack_198.x = 0.0;
            IStack_198.y = 0.0;
            local_1b0 = (ImGuiDockNode *)0x0;
            local_1b8[0] = 0;
            local_1a8._0_4_ = -1;
            local_1a8._4_4_ = 0.0;
            local_150.FutureNode.Windows.Size = 0;
            local_150.FutureNode.Windows.Capacity = 0;
            local_150.FutureNode.Windows.Data = (ImGuiWindow **)0x0;
            local_150.FutureNode.WindowClass.ClassId = 0;
            local_150.FutureNode.WindowClass.ParentViewportId = 0;
            local_150.FutureNode.WindowClass.ViewportFlagsOverrideSet = 0;
            local_150.FutureNode.WindowClass.ViewportFlagsOverrideClear = 0;
            local_150.FutureNode.WindowClass.DockingAlwaysTabBar = false;
            local_150.FutureNode.WindowClass.DockingAllowUnclassed = true;
            local_150.FutureNode.Pos.x = 0.0;
            local_150.FutureNode.Pos.y = 0.0;
            local_150.FutureNode.Size.x = 0.0;
            local_150.FutureNode.Size.y = 0.0;
            local_150.FutureNode.SizeRef.x = 0.0;
            local_150.FutureNode.SizeRef.y = 0.0;
            local_150.FutureNode.ID = 0;
            local_150.FutureNode.SharedFlags = 0;
            local_150.FutureNode.LocalFlags = 0;
            local_150.FutureNode.TabBar = (ImGuiTabBar *)0x0;
            local_150.FutureNode.ParentNode = (ImGuiDockNode *)0x0;
            local_150.FutureNode.ChildNodes[0] = (ImGuiDockNode *)0x0;
            local_150.FutureNode.ChildNodes[1] = (ImGuiDockNode *)0x0;
            local_150.FutureNode.SplitAxis = -1;
            local_150.FutureNode.State = ImGuiDockNodeState_Unknown;
            local_150.FutureNode.HostWindow = (ImGuiWindow *)0x0;
            local_150.FutureNode.VisibleWindow = (ImGuiWindow *)0x0;
            local_150.FutureNode.CentralNode = (ImGuiDockNode *)0x0;
            local_150.FutureNode.OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
            local_150.FutureNode.LastFrameAlive = -1;
            local_150.FutureNode.LastFrameActive = -1;
            local_150.FutureNode.LastFrameFocused = -1;
            local_150.FutureNode.LastFocusedNodeID = 0;
            local_150.FutureNode.SelectedTabID = 0;
            local_150.FutureNode.WantCloseTabID = 0;
            local_150.FutureNode._176_2_ = 0x209;
            local_150.FutureNode._178_1_ = 0;
            local_150.DropRectsDraw[4].Min.x = 0.0;
            local_150.DropRectsDraw[4].Min.y = 0.0;
            local_150.DropRectsDraw[4].Max.x = 0.0;
            local_150.DropRectsDraw[4].Max.y = 0.0;
            local_150.DropRectsDraw[3].Min.x = 0.0;
            local_150.DropRectsDraw[3].Min.y = 0.0;
            local_150.DropRectsDraw[3].Max.x = 0.0;
            local_150.DropRectsDraw[3].Max.y = 0.0;
            local_150.DropRectsDraw[2].Min.x = 0.0;
            local_150.DropRectsDraw[2].Min.y = 0.0;
            local_150.DropRectsDraw[2].Max.x = 0.0;
            local_150.DropRectsDraw[2].Max.y = 0.0;
            local_150.DropRectsDraw[1].Min.x = 0.0;
            local_150.DropRectsDraw[1].Min.y = 0.0;
            local_150.DropRectsDraw[1].Max.x = 0.0;
            local_150.DropRectsDraw[1].Max.y = 0.0;
            local_150.DropRectsDraw[0].Min.x = 0.0;
            local_150.DropRectsDraw[0].Min.y = 0.0;
            local_150.DropRectsDraw[0].Max.x = 0.0;
            local_150.DropRectsDraw[0].Max.y = 0.0;
            local_150.SplitNode = (ImGuiDockNode *)0x0;
            local_150.IsDropAllowed = false;
            local_150.IsCenterAvailable = false;
            local_150.IsSidesAvailable = false;
            local_150.IsSplitDirExplicit = false;
            local_150.SplitDir = -1;
            local_150.SplitRatio = 0.0;
            if ((host_node == (ImGuiDockNode *)0x0) ||
               ((pIVar3 = host_node, host_node->ParentNode == (ImGuiDockNode *)0x0 &&
                ((host_node->LocalFlags & 0x800) == 0)))) {
              bVar4 = false;
              DockNodePreviewDockSetup(window,host_node,root_payload,data,is_explicit_target,false);
            }
            else {
              do {
                host_node_00 = pIVar3;
                pIVar3 = host_node_00->ParentNode;
              } while (pIVar3 != (ImGuiDockNode *)0x0);
              DockNodePreviewDockSetup
                        (window,host_node_00,root_payload,&local_150,is_explicit_target,true);
              bVar4 = local_150.IsSplitDirExplicit;
              data = &local_150;
              if (local_150.IsSplitDirExplicit == false) {
                data = (ImGuiDockPreviewData *)&local_270;
              }
              DockNodePreviewDockSetup
                        (window,host_node,root_payload,(ImGuiDockPreviewData *)&local_270,
                         is_explicit_target,false);
              if (bVar4 == true) {
                local_1b8[0] = local_1b8[0] & 0xffffff00;
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
            }
            DockNodePreviewDockRender
                      (window,host_node,root_payload,(ImGuiDockPreviewData *)&local_270);
            DockNodePreviewDockRender(window,host_node,root_payload,&local_150);
            if ((data->IsDropAllowed == true) && ((ctx->DragDropPayload).Delivery == true)) {
              DockContextQueueDock
                        (ctx,window,data->SplitNode,root_payload,data->SplitDir,data->SplitRatio,
                         bVar4);
            }
            ImGuiDockNode::~ImGuiDockNode(&local_150.FutureNode);
            ImGuiDockNode::~ImGuiDockNode((ImGuiDockNode *)&local_270);
          }
        }
      }
      GImGui->DragDropWithinSourceOrTarget = false;
    }
  }
  return;
}

Assistant:

void ImGui::BeginDockableDragDropTarget(ImGuiWindow* window)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    //IM_ASSERT(window->RootWindow == window); // May also be a DockSpace
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    if (!g.DragDropActive)
        return;
    if (!BeginDragDropTargetCustom(window->Rect(), window->ID))
        return;

    // Peek into the payload before calling AcceptDragDropPayload() so we can handle overlapping dock nodes with filtering
    // (this is a little unusual pattern, normally most code would call AcceptDragDropPayload directly)
    const ImGuiPayload* payload = &g.DragDropPayload;
    if (!payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) || !DockNodeIsDropAllowed(window, *(ImGuiWindow**)payload->Data))
    {
        EndDragDropTarget();
        return;
    }

    ImGuiWindow* payload_window = *(ImGuiWindow**)payload->Data;
    if (AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, ImGuiDragDropFlags_AcceptBeforeDelivery | ImGuiDragDropFlags_AcceptNoDrawDefaultRect))
    {
        // Select target node
        ImGuiDockNode* node = NULL;
        bool allow_null_target_node = false;
        if (window->DockNodeAsHost)
            node = DockNodeTreeFindNodeByPos(window->DockNodeAsHost, g.IO.MousePos);
        else if (window->DockNode) // && window->DockIsActive)
            node = window->DockNode;
        else
            allow_null_target_node = true; // Dock into a regular window

        const ImRect explicit_target_rect = (node && node->TabBar && !node->IsHiddenTabBar() && !node->IsNoTabBar()) ? node->TabBar->BarRect : ImRect(window->Pos, window->Pos + ImVec2(window->Size.x, GetFrameHeight()));
        const bool is_explicit_target = g.IO.ConfigDockingWithShift || IsMouseHoveringRect(explicit_target_rect.Min, explicit_target_rect.Max);

        // Preview docking request and find out split direction/ratio
        //const bool do_preview = true;     // Ignore testing for payload->IsPreview() which removes one frame of delay, but breaks overlapping drop targets within the same window.
        const bool do_preview = payload->IsPreview() || payload->IsDelivery();
        if (do_preview && (node != NULL || allow_null_target_node))
        {
            ImGuiDockPreviewData split_inner;
            ImGuiDockPreviewData split_outer;
            ImGuiDockPreviewData* split_data = &split_inner;
            if (node && (node->ParentNode || node->IsCentralNode()))
                if (ImGuiDockNode* root_node = DockNodeGetRootNode(node))
                {
                    DockNodePreviewDockSetup(window, root_node, payload_window, &split_outer, is_explicit_target, true);
                    if (split_outer.IsSplitDirExplicit)
                        split_data = &split_outer;
                }
            DockNodePreviewDockSetup(window, node, payload_window, &split_inner, is_explicit_target, false);
            if (split_data == &split_outer)
                split_inner.IsDropAllowed = false;

            // Draw inner then outer, so that previewed tab (in inner data) will be behind the outer drop boxes
            DockNodePreviewDockRender(window, node, payload_window, &split_inner);
            DockNodePreviewDockRender(window, node, payload_window, &split_outer);

            // Queue docking request
            if (split_data->IsDropAllowed && payload->IsDelivery())
                DockContextQueueDock(ctx, window, split_data->SplitNode, payload_window, split_data->SplitDir, split_data->SplitRatio, split_data == &split_outer);
        }
    }
    EndDragDropTarget();
}